

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O1

metasize_t btree_read_meta(btree *btree,void *buf)

{
  bnode *node;
  voidref pvVar1;
  metasize_t mVar2;
  
  pvVar1 = (*btree->blk_ops->blk_read)(btree->blk_handle,btree->root_bid);
  if ((*(byte *)((long)pvVar1 + 2) & 2) == 0) {
    *(long *)((long)pvVar1 + 8) = (long)pvVar1 + 0x10;
    mVar2 = 0;
  }
  else {
    mVar2 = *(ushort *)((long)pvVar1 + 0x10) << 8 | *(ushort *)((long)pvVar1 + 0x10) >> 8;
    *(ulong *)((long)pvVar1 + 8) = (long)pvVar1 + 0x10 + (ulong)(mVar2 + 0x11 & 0xfffffff0);
    memcpy(buf,(void *)((long)pvVar1 + 0x12),(ulong)mVar2);
  }
  return mVar2;
}

Assistant:

metasize_t btree_read_meta(struct btree *btree, void *buf)
{
    void *addr;
    void *ptr;
    metasize_t size;
    struct bnode *node;

    addr = btree->blk_ops->blk_read(btree->blk_handle, btree->root_bid);
    node = _fetch_bnode(btree, addr, btree->height);
    if (node->flag & BNODE_MASK_METADATA) {
        ptr = ((uint8_t *)node) + sizeof(struct bnode);
        memcpy(&size, (uint8_t *)ptr, sizeof(metasize_t));
        size = _endian_decode(size);
        memcpy(buf, (uint8_t *)ptr + sizeof(metasize_t), size);
    } else {
        size = 0;
    }

    return size;
}